

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O0

void __thiscall
duckdb::UnaryAggregateHeap<double,_duckdb::LessThan>::Insert
          (UnaryAggregateHeap<double,_duckdb::LessThan> *this,ArenaAllocator *allocator,
          double *value)

{
  double dVar1;
  bool bVar2;
  HeapEntry<double> *in_RDX;
  ArenaAllocator *in_RSI;
  HeapEntry<double> *in_RDI;
  HeapEntry<double> *unaff_retaddr;
  double *in_stack_ffffffffffffffd8;
  HeapEntry<double> *__last;
  
  if ((ulong)in_RDI[2].value < (ulong)in_RDI->value) {
    dVar1 = in_RDI[2].value;
    in_RDI[2].value = (double)((long)dVar1 + 1);
    HeapEntry<double>::Assign
              ((HeapEntry<double> *)((long)in_RDI[1].value + (long)dVar1 * 8),in_RSI,&in_RDX->value)
    ;
    ::std::
    push_heap<duckdb::HeapEntry<double>*,bool(*)(duckdb::HeapEntry<double>const&,duckdb::HeapEntry<double>const&)>
              (unaff_retaddr,in_RDI,(_func_bool_HeapEntry<double>_ptr_HeapEntry<double>_ptr *)in_RSI
              );
  }
  else {
    __last = in_RDI;
    bVar2 = LessThan::Operation<double>(&in_RDI->value,in_stack_ffffffffffffffd8);
    if (bVar2) {
      ::std::
      pop_heap<duckdb::HeapEntry<double>*,bool(*)(duckdb::HeapEntry<double>const&,duckdb::HeapEntry<double>const&)>
                ((HeapEntry<double> *)in_RSI,in_RDX,
                 (_func_bool_HeapEntry<double>_ptr_HeapEntry<double>_ptr *)in_RDI);
      HeapEntry<double>::Assign
                ((HeapEntry<double> *)((long)in_RDI[1].value + ((long)in_RDI[2].value + -1) * 8),
                 in_RSI,&in_RDX->value);
      ::std::
      push_heap<duckdb::HeapEntry<double>*,bool(*)(duckdb::HeapEntry<double>const&,duckdb::HeapEntry<double>const&)>
                (unaff_retaddr,__last,
                 (_func_bool_HeapEntry<double>_ptr_HeapEntry<double>_ptr *)in_RSI);
    }
  }
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const T &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size++].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (T_COMPARATOR::Operation(value, heap[0].value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}